

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

int N_VWrmsNormVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,realtype *nrm)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  realtype rVar6;
  double dVar7;
  double dVar8;
  
  if (0 < nvec) {
    if (nvec == 1) {
      rVar6 = N_VWrmsNorm_Serial(*X,*W);
      *nrm = rVar6;
    }
    else {
      uVar1 = *(*X)->content;
      uVar5 = 0;
      do {
        lVar2 = *(long *)((long)X[uVar5]->content + 8);
        lVar3 = *(long *)((long)W[uVar5]->content + 8);
        nrm[uVar5] = 0.0;
        if (0 < (int)uVar1) {
          rVar6 = nrm[uVar5];
          uVar4 = 0;
          do {
            dVar7 = *(double *)(lVar2 + uVar4 * 8) * *(double *)(lVar3 + uVar4 * 8);
            rVar6 = rVar6 + dVar7 * dVar7;
            nrm[uVar5] = rVar6;
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        dVar7 = nrm[uVar5] / (double)(int)uVar1;
        dVar8 = 0.0;
        if (0.0 < dVar7) {
          if (dVar7 < 0.0) {
            dVar8 = sqrt(dVar7);
          }
          else {
            dVar8 = SQRT(dVar7);
          }
        }
        nrm[uVar5] = dVar8;
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)nvec);
    }
    return 0;
  }
  return -1;
}

Assistant:

int N_VWrmsNormVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                  realtype* nrm)
{
  int          i;
  sunindextype j, N;
  realtype*    wd=NULL;
  realtype*    xd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VWrmsNorm */
  if (nvec == 1) {
    nrm[0] = N_VWrmsNorm_Serial(X[0], W[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(X[0]);

  /* compute the WRMS norm for each vector in the vector array */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    wd = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j=0; j<N; j++) {
      nrm[i] += SUNSQR(xd[j] * wd[j]);
    }
    nrm[i] = SUNRsqrt(nrm[i]/N);
  }

  return(0);
}